

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::ChannelsMerge(ImDrawList *this)

{
  value_type *pvVar1;
  value_type *pvVar2;
  long lVar3;
  int i;
  int i_00;
  int iVar4;
  int iVar5;
  ImDrawCmd *__dest;
  
  if (1 < this->_ChannelsCount) {
    iVar4 = 0;
    ChannelsSetCurrent(this,0);
    if ((this->CmdBuffer).Size != 0) {
      pvVar1 = ImVector<ImDrawCmd>::back(&this->CmdBuffer);
      if (pvVar1->ElemCount == 0) {
        ImVector<ImDrawCmd>::pop_back(&this->CmdBuffer);
      }
    }
    iVar5 = 0;
    for (i_00 = 1; i_00 < this->_ChannelsCount; i_00 = i_00 + 1) {
      pvVar2 = ImVector<ImDrawChannel>::operator[](&this->_Channels,i_00);
      if ((pvVar2->CmdBuffer).Size != 0) {
        pvVar1 = ImVector<ImDrawCmd>::back(&pvVar2->CmdBuffer);
        if (pvVar1->ElemCount == 0) {
          ImVector<ImDrawCmd>::pop_back(&pvVar2->CmdBuffer);
        }
      }
      iVar5 = iVar5 + (pvVar2->CmdBuffer).Size;
      iVar4 = iVar4 + (pvVar2->IdxBuffer).Size;
    }
    ImVector<ImDrawCmd>::resize(&this->CmdBuffer,(this->CmdBuffer).Size + iVar5);
    ImVector<unsigned_short>::resize(&this->IdxBuffer,(this->IdxBuffer).Size + iVar4);
    __dest = (this->CmdBuffer).Data + ((long)(this->CmdBuffer).Size - (long)iVar5);
    this->_IdxWritePtr = (this->IdxBuffer).Data + ((long)(this->IdxBuffer).Size - (long)iVar4);
    for (iVar4 = 1; iVar4 < this->_ChannelsCount; iVar4 = iVar4 + 1) {
      pvVar2 = ImVector<ImDrawChannel>::operator[](&this->_Channels,iVar4);
      lVar3 = (long)(pvVar2->CmdBuffer).Size;
      if (lVar3 != 0) {
        memcpy(__dest,(pvVar2->CmdBuffer).Data,lVar3 * 0x30);
        __dest = __dest + lVar3;
      }
      lVar3 = (long)(pvVar2->IdxBuffer).Size;
      if (lVar3 != 0) {
        memcpy(this->_IdxWritePtr,(pvVar2->IdxBuffer).Data,lVar3 * 2);
        this->_IdxWritePtr = this->_IdxWritePtr + lVar3;
      }
    }
    UpdateClipRect(this);
    this->_ChannelsCount = 1;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsMerge()
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_ChannelsCount <= 1)
        return;

    ChannelsSetCurrent(0);
    if (CmdBuffer.Size && CmdBuffer.back().ElemCount == 0)
        CmdBuffer.pop_back();

    int new_cmd_buffer_count = 0, new_idx_buffer_count = 0;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch.CmdBuffer.Size && ch.CmdBuffer.back().ElemCount == 0)
            ch.CmdBuffer.pop_back();
        new_cmd_buffer_count += ch.CmdBuffer.Size;
        new_idx_buffer_count += ch.IdxBuffer.Size;
    }
    CmdBuffer.resize(CmdBuffer.Size + new_cmd_buffer_count);
    IdxBuffer.resize(IdxBuffer.Size + new_idx_buffer_count);

    ImDrawCmd* cmd_write = CmdBuffer.Data + CmdBuffer.Size - new_cmd_buffer_count;
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch.CmdBuffer.Size) { memcpy(cmd_write, ch.CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch.IdxBuffer.Size) { memcpy(_IdxWritePtr, ch.IdxBuffer.Data, sz * sizeof(ImDrawIdx)); _IdxWritePtr += sz; }
    }
    UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    _ChannelsCount = 1;
}